

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O1

void __thiscall SQCompilation::CodegenVisitor::visitArrayExpr(CodegenVisitor *this,ArrayExpr *expr)

{
  bool bVar1;
  SQFuncState *this_00;
  Node *this_01;
  undefined2 uVar2;
  SQInteger SVar3;
  SQInteger SVar4;
  long line;
  ulong uVar5;
  SQInstruction local_38;
  
  maybeAddInExprLine(this,&expr->super_Expr);
  this_00 = this->_fs;
  SVar3 = SQFuncState::PushTarget(this_00,-1);
  local_38._arg0 = (uchar)SVar3;
  local_38._0_5_ = 0x2a00000000;
  uVar2 = local_38._4_2_;
  local_38.op = (char)uVar2;
  local_38._arg0 = (char)((ushort)uVar2 >> 8);
  local_38.field_0 = (anon_union_4_2_91d81cc7_for_SQInstruction_0)(expr->_inits)._size;
  local_38._arg2 = '\0';
  local_38._arg3 = '\x01';
  SQFuncState::AddInstruction(this_00,&local_38);
  if ((expr->_inits)._size != 0) {
    uVar5 = 0;
    do {
      this_01 = &(expr->_inits)._vals[uVar5]->super_Node;
      if ((uVar5 < 100) && (line = (long)(this_01->_coordinates).lineStart, line != -1)) {
        SQFuncState::AddLineInfos(this->_fs,line,false,false);
      }
      bVar1 = this->_donot_get;
      this->_donot_get = false;
      Node::visit<SQCompilation::CodegenVisitor>(this_01,this);
      this->_donot_get = bVar1;
      SVar3 = SQFuncState::PopTarget(this->_fs);
      SVar4 = SQFuncState::TopTarget(this->_fs);
      local_38._arg0 = (uchar)SVar4;
      local_38._0_5_ = 0x2b00000000;
      uVar2 = local_38._4_2_;
      local_38.op = (char)uVar2;
      local_38._arg0 = (char)((ushort)uVar2 >> 8);
      local_38.field_0._arg1 = (int)SVar3;
      local_38._arg2 = '\0';
      local_38._arg3 = '\0';
      SQFuncState::AddInstruction(this->_fs,&local_38);
      uVar5 = uVar5 + 1;
    } while (uVar5 < (expr->_inits)._size);
  }
  return;
}

Assistant:

void CodegenVisitor::visitArrayExpr(ArrayExpr *expr) {
    maybeAddInExprLine(expr);
    const auto &inits = expr->initializers();

    _fs->AddInstruction(_OP_NEWOBJ, _fs->PushTarget(), inits.size(), 0, NOT_ARRAY);

    for (SQUnsignedInteger i = 0; i < inits.size(); ++i) {
        Expr *valExpr = inits[i];
#if SQ_LINE_INFO_IN_STRUCTURES
        if (i < 100 && valExpr->lineStart() != -1)
            _fs->AddLineInfos(valExpr->lineStart(), false, false);
#endif
        visitForceGet(valExpr);
        SQInteger val = _fs->PopTarget();
        SQInteger array = _fs->TopTarget();
        _fs->AddInstruction(_OP_APPENDARRAY, array, val, AAT_STACK);
    }
}